

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_alsa.c
# Opt level: O2

void alsa_stream_destroy(cubeb_stream_conflict1 *stm)

{
  pthread_mutex_t *__mutex;
  cubeb_conflict1 *pcVar1;
  cubeb_conflict1 *pcVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  snd_pcm_t *pcm;
  
  if (((stm == (cubeb_stream_conflict1 *)0x0) || (ERROR < stm->state)) ||
     ((0x15U >> (stm->state & 0x1f) & 1) == 0)) {
    __assert_fail("stm && (stm->state == INACTIVE || stm->state == ERROR || stm->state == DRAINING)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_alsa.c"
                  ,0x47a,"void alsa_stream_destroy(cubeb_stream *)");
  }
  pcVar1 = stm->context;
  if (stm->other_stream != (cubeb_stream_conflict1 *)0x0) {
    stm->other_stream->other_stream = (cubeb_stream_conflict1 *)0x0;
    alsa_stream_destroy(stm->other_stream);
  }
  __mutex = &stm->mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  pcm = stm->pcm;
  if (pcm != (snd_pcm_t *)0x0) {
    if (stm->state == DRAINING) {
      (*cubeb_snd_pcm_drain)(pcm);
      pcm = stm->pcm;
    }
    alsa_locked_pcm_close(pcm);
    stm->pcm = (snd_pcm_t *)0x0;
  }
  free(stm->saved_fds);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  pthread_mutex_destroy((pthread_mutex_t *)__mutex);
  iVar4 = pthread_cond_destroy((pthread_cond_t *)&stm->cond);
  if (iVar4 != 0) {
    __assert_fail("r == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_alsa.c"
                  ,0x490,"void alsa_stream_destroy(cubeb_stream *)");
  }
  pcVar2 = stm->context;
  pthread_mutex_lock((pthread_mutex_t *)&pcVar2->mutex);
  lVar3 = 0;
  do {
    lVar5 = lVar3;
    if (lVar5 == 0x10) goto LAB_0010d027;
    lVar3 = lVar5 + 1;
  } while (pcVar2->streams[lVar5] != stm);
  pcVar2->streams[lVar5] = (cubeb_stream_conflict1 *)0x0;
LAB_0010d027:
  pthread_mutex_unlock((pthread_mutex_t *)&pcVar2->mutex);
  pthread_mutex_lock((pthread_mutex_t *)&pcVar1->mutex);
  if (pcVar1->active_streams != 0) {
    pcVar1->active_streams = pcVar1->active_streams - 1;
    pthread_mutex_unlock((pthread_mutex_t *)&pcVar1->mutex);
    free(stm->buffer);
    free(stm);
    return;
  }
  __assert_fail("ctx->active_streams >= 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_alsa.c"
                ,0x495,"void alsa_stream_destroy(cubeb_stream *)");
}

Assistant:

static void
alsa_stream_destroy(cubeb_stream * stm)
{
  int r;
  cubeb * ctx;

  assert(stm && (stm->state == INACTIVE || stm->state == ERROR ||
                 stm->state == DRAINING));

  ctx = stm->context;

  if (stm->other_stream) {
    stm->other_stream->other_stream = NULL; // to stop infinite recursion
    alsa_stream_destroy(stm->other_stream);
  }

  pthread_mutex_lock(&stm->mutex);
  if (stm->pcm) {
    if (stm->state == DRAINING) {
      WRAP(snd_pcm_drain)(stm->pcm);
    }
    alsa_locked_pcm_close(stm->pcm);
    stm->pcm = NULL;
  }
  free(stm->saved_fds);
  pthread_mutex_unlock(&stm->mutex);
  pthread_mutex_destroy(&stm->mutex);

  r = pthread_cond_destroy(&stm->cond);
  assert(r == 0);

  alsa_unregister_stream(stm);

  pthread_mutex_lock(&ctx->mutex);
  assert(ctx->active_streams >= 1);
  ctx->active_streams -= 1;
  pthread_mutex_unlock(&ctx->mutex);

  free(stm->buffer);

  free(stm);
}